

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

optional<wasm::HeapType> wasm::HeapType::getLeastUpperBound(HeapType a,HeapType b)

{
  bool bVar1;
  BasicHeapType BVar2;
  BasicHeapType BVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  _Optional_payload_base<wasm::HeapType> _Var4;
  pair<std::__detail::_Node_iterator<wasm::(anonymous_namespace)::HeapTypeInfo_*,_true,_false>,_bool>
  pVar5;
  optional<wasm::HeapType> oVar6;
  HeapType local_148;
  _Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> local_140;
  byte local_138;
  _Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> local_130;
  byte local_128;
  HeapType local_120;
  _Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> local_118;
  byte local_110;
  _Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> local_108;
  byte local_100;
  undefined4 local_f4;
  uintptr_t local_f0;
  uintptr_t local_e8;
  HeapTypeInfo *local_e0;
  HeapTypeInfo *nextB;
  HeapTypeInfo *nextA;
  undefined1 local_c8;
  _Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false> local_c0;
  undefined1 local_b8;
  undefined1 local_a0 [8];
  unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
  seen;
  HeapTypeInfo *local_50;
  HeapTypeInfo *infoB;
  HeapTypeInfo *local_40;
  HeapTypeInfo *infoA;
  uintptr_t local_30;
  HeapType local_28;
  HeapType b_local;
  HeapType a_local;
  bool local_10;
  
  local_28.id = b.id;
  b_local = a;
  bVar1 = operator==(&b_local,&local_28);
  if (bVar1) {
    std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
              ((optional<wasm::HeapType> *)&a_local,&b_local);
    _Var4._8_8_ = extraout_RDX;
    _Var4._M_payload._M_value.id = (HeapType)(HeapType)a_local.id;
  }
  else {
    BVar2 = getBottom(&b_local);
    BVar3 = getBottom(&local_28);
    if (BVar2 == BVar3) {
      bVar1 = isBottom(&b_local);
      if (bVar1) {
        std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                  ((optional<wasm::HeapType> *)&a_local,&local_28);
        _Var4._8_8_ = extraout_RDX_01;
        _Var4._M_payload._M_value.id = (HeapType)(HeapType)a_local.id;
      }
      else {
        bVar1 = isBottom(&local_28);
        if (bVar1) {
          std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                    ((optional<wasm::HeapType> *)&a_local,&b_local);
          _Var4._8_8_ = extraout_RDX_02;
          _Var4._M_payload._M_value.id = (HeapType)(HeapType)a_local.id;
        }
        else {
          bVar1 = isBasic(&b_local);
          if ((bVar1) || (bVar1 = isBasic(&local_28), bVar1)) {
            local_30 = b_local.id;
            BVar2 = anon_unknown_0::getBasicHeapSupertype(b_local);
            infoA = (HeapTypeInfo *)local_28.id;
            BVar3 = anon_unknown_0::getBasicHeapSupertype(local_28);
            _Var4 = (_Optional_payload_base<wasm::HeapType>)
                    anon_unknown_0::getBasicHeapTypeLUB(BVar2,BVar3);
            local_10 = _Var4._M_engaged;
          }
          else {
            infoB = (HeapTypeInfo *)b_local.id;
            local_40 = anon_unknown_0::getHeapTypeInfo(b_local);
            local_50 = anon_unknown_0::getHeapTypeInfo(local_28);
            if (local_40->kind == local_50->kind) {
              std::
              unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
              ::unordered_set((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                               *)local_a0);
              pVar5 = std::
                      unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                *)local_a0,&local_40);
              local_c0._M_cur =
                   (__node_type *)
                   pVar5.first.
                   super__Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>.
                   _M_cur;
              local_b8 = pVar5.second;
              pVar5 = std::
                      unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                      ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                *)local_a0,&local_50);
              nextA = (HeapTypeInfo *)
                      pVar5.first.
                      super__Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>.
                      _M_cur;
              local_c8 = pVar5.second;
              while( true ) {
                do {
                  nextB = local_40->supertype;
                  local_e0 = local_50->supertype;
                  if ((nextB == (HeapTypeInfo *)0x0) && (local_e0 == (HeapTypeInfo *)0x0)) {
                    local_e8 = b_local.id;
                    BVar2 = anon_unknown_0::getBasicHeapSupertype(b_local);
                    local_f0 = local_28.id;
                    BVar3 = anon_unknown_0::getBasicHeapSupertype(local_28);
                    oVar6 = anon_unknown_0::getBasicHeapTypeLUB(BVar2,BVar3);
                    a_local.id = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::HeapType>._M_payload;
                    local_10 = oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::HeapType>._M_engaged;
                    goto LAB_02673f9d;
                  }
                  if (nextB != (HeapTypeInfo *)0x0) {
                    pVar5 = std::
                            unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                            ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                      *)local_a0,&nextB);
                    local_118._M_cur =
                         (__node_type *)
                         pVar5.first.
                         super__Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>
                         ._M_cur;
                    local_110 = pVar5.second;
                    local_108._M_cur = local_118._M_cur;
                    local_100 = local_110;
                    if (((local_110 ^ 0xff) & 1) != 0) {
                      HeapType(&local_120,(TypeID)nextB);
                      std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                                ((optional<wasm::HeapType> *)&a_local,&local_120);
                      goto LAB_02673f9d;
                    }
                    local_40 = nextB;
                  }
                } while (local_e0 == (HeapTypeInfo *)0x0);
                pVar5 = std::
                        unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                        ::insert((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                  *)local_a0,&local_e0);
                local_140._M_cur =
                     (__node_type *)
                     pVar5.first.
                     super__Node_iterator_base<wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>.
                     _M_cur;
                local_138 = pVar5.second;
                local_130._M_cur = local_140._M_cur;
                local_128 = local_138;
                if (((local_138 ^ 0xff) & 1) != 0) break;
                local_50 = local_e0;
              }
              HeapType(&local_148,(TypeID)local_e0);
              std::optional<wasm::HeapType>::optional<wasm::HeapType,_true>
                        ((optional<wasm::HeapType> *)&a_local,&local_148);
LAB_02673f9d:
              local_f4 = 1;
              std::
              unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
              ::~unordered_set((unordered_set<wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::hash<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::equal_to<wasm::(anonymous_namespace)::HeapTypeInfo_*>,_std::allocator<wasm::(anonymous_namespace)::HeapTypeInfo_*>_>
                                *)local_a0);
              _Var4._8_8_ = extraout_RDX_03;
              _Var4._M_payload._M_value.id = (HeapType)(HeapType)a_local.id;
            }
            else {
              BVar2 = anon_unknown_0::getBasicHeapSupertype(b_local);
              seen._M_h._M_single_bucket = (__node_base_ptr)local_28.id;
              BVar3 = anon_unknown_0::getBasicHeapSupertype(local_28);
              _Var4 = (_Optional_payload_base<wasm::HeapType>)
                      anon_unknown_0::getBasicHeapTypeLUB(BVar2,BVar3);
              local_10 = _Var4._M_engaged;
            }
          }
        }
      }
    }
    else {
      std::optional<wasm::HeapType>::optional((optional<wasm::HeapType> *)&a_local);
      _Var4._8_8_ = extraout_RDX_00;
      _Var4._M_payload._M_value.id = (HeapType)(HeapType)a_local.id;
    }
  }
  a_local.id = (uintptr_t)_Var4._M_payload;
  oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_7_ = _Var4._9_7_;
  oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = local_10;
  oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
       (HeapType)(HeapType)a_local.id;
  return (optional<wasm::HeapType>)
         oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>;
}

Assistant:

std::optional<HeapType> HeapType::getLeastUpperBound(HeapType a, HeapType b) {
  if (a == b) {
    return a;
  }
  if (a.getBottom() != b.getBottom()) {
    return {};
  }
  if (a.isBottom()) {
    return b;
  }
  if (b.isBottom()) {
    return a;
  }
  if (a.isBasic() || b.isBasic()) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  auto* infoA = getHeapTypeInfo(a);
  auto* infoB = getHeapTypeInfo(b);

  if (infoA->kind != infoB->kind) {
    return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                               getBasicHeapSupertype(b));
  }

  // Walk up the subtype tree to find the LUB. Ascend the tree from both `a`
  // and `b` in lockstep. The first type we see for a second time must be the
  // LUB because there are no cycles and the only way to encounter a type
  // twice is for it to be on the path above both `a` and `b`.
  std::unordered_set<HeapTypeInfo*> seen;
  seen.insert(infoA);
  seen.insert(infoB);
  while (true) {
    auto* nextA = infoA->supertype;
    auto* nextB = infoB->supertype;
    if (nextA == nullptr && nextB == nullptr) {
      // Did not find a LUB in the subtype tree.
      return getBasicHeapTypeLUB(getBasicHeapSupertype(a),
                                 getBasicHeapSupertype(b));
    }
    if (nextA) {
      if (!seen.insert(nextA).second) {
        return HeapType(uintptr_t(nextA));
      }
      infoA = nextA;
    }
    if (nextB) {
      if (!seen.insert(nextB).second) {
        return HeapType(uintptr_t(nextB));
      }
      infoB = nextB;
    }
  }
}